

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsOpen(sqlite3_vfs *pVfs,char *zName,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  long lVar1;
  int iVar2;
  sqlite3_io_methods *psVar3;
  rbu_file *prVar4;
  char *zName_00;
  size_t __n;
  char *zCopy;
  size_t nCopy;
  char *zBase;
  rbu_file *pDb;
  sqlite3_io_methods *psStack_58;
  int oflags;
  char *zOpen;
  int rc;
  rbu_file *pFd;
  sqlite3_vfs *pRealVfs;
  rbu_vfs *pRbuVfs;
  int *pOutFlags_local;
  int flags_local;
  sqlite3_file *pFile_local;
  char *zName_local;
  sqlite3_vfs *pVfs_local;
  
  lVar1 = *(long *)(pVfs + 1);
  zOpen._4_4_ = 0;
  memset(pFile,0,0x68);
  pFile[1].pMethods = (sqlite3_io_methods *)(pFile + 0xd);
  pFile[2].pMethods = (sqlite3_io_methods *)pVfs;
  *(int *)&pFile[5].pMethods = flags;
  psStack_58 = (sqlite3_io_methods *)zName;
  if (zName == (char *)0x0) {
    pFile[3].pMethods = (sqlite3_io_methods *)pVfs[1].pNext;
  }
  else if ((flags & 0x100U) == 0) {
    if (((flags & 0x80000U) != 0) &&
       (prVar4 = rbuFindMaindb((rbu_vfs *)pVfs,zName,0), prVar4 != (rbu_file *)0x0)) {
      if ((prVar4->pRbu != (sqlite3rbu *)0x0) && (prVar4->pRbu->eStage == 1)) {
        nCopy = (size_t)zName;
        if (prVar4->pRbu->zTarget == (char *)0x0) {
          zName_00 = sqlite3_db_filename(prVar4->pRbu->dbRbu,"main");
          nCopy = (size_t)rbuMainToWal(zName_00,0x40);
        }
        __n = strlen((char *)nCopy);
        psStack_58 = (sqlite3_io_methods *)sqlite3_malloc64(__n + 2);
        if (psStack_58 == (sqlite3_io_methods *)0x0) {
          zOpen._4_4_ = 7;
          psStack_58 = (sqlite3_io_methods *)zName;
        }
        else {
          memcpy(psStack_58,(void *)nCopy,__n);
          *(undefined1 *)((long)psStack_58 + (__n - 3)) = 0x6f;
          *(undefined1 *)((long)&psStack_58->iVersion + __n) = 0;
          *(undefined1 *)((long)&psStack_58->iVersion + __n + 1) = 0;
          pFile[8].pMethods = psStack_58;
        }
        pFile[3].pMethods = (sqlite3_io_methods *)prVar4->pRbu;
      }
      prVar4->pWalFd = (rbu_file *)pFile;
    }
  }
  else {
    psVar3 = (sqlite3_io_methods *)rbuMainToWal(zName,flags);
    pFile[9].pMethods = psVar3;
  }
  pDb._4_4_ = flags;
  if (((flags & 0x100U) != 0) && (iVar2 = sqlite3_uri_boolean(zName,"rbu_memory",0), iVar2 != 0)) {
    pDb._4_4_ = 0x21e;
    psStack_58 = (sqlite3_io_methods *)0x0;
  }
  if (zOpen._4_4_ == 0) {
    zOpen._4_4_ = (**(code **)(lVar1 + 0x28))
                            (lVar1,psStack_58,pFile[1].pMethods,pDb._4_4_,pOutFlags);
  }
  if (*(long *)pFile[1].pMethods == 0) {
    sqlite3_free(pFile[8].pMethods);
  }
  else {
    pFile->pMethods = &rbuVfsOpen::rbuvfs_io_methods;
    if ((flags & 0x100U) != 0) {
      rbuMainlistAdd((rbu_file *)pFile);
    }
  }
  return zOpen._4_4_;
}

Assistant:

static int rbuVfsOpen(
  sqlite3_vfs *pVfs,
  const char *zName,
  sqlite3_file *pFile,
  int flags,
  int *pOutFlags
){
  static sqlite3_io_methods rbuvfs_io_methods = {
    2,                            /* iVersion */
    rbuVfsClose,                  /* xClose */
    rbuVfsRead,                   /* xRead */
    rbuVfsWrite,                  /* xWrite */
    rbuVfsTruncate,               /* xTruncate */
    rbuVfsSync,                   /* xSync */
    rbuVfsFileSize,               /* xFileSize */
    rbuVfsLock,                   /* xLock */
    rbuVfsUnlock,                 /* xUnlock */
    rbuVfsCheckReservedLock,      /* xCheckReservedLock */
    rbuVfsFileControl,            /* xFileControl */
    rbuVfsSectorSize,             /* xSectorSize */
    rbuVfsDeviceCharacteristics,  /* xDeviceCharacteristics */
    rbuVfsShmMap,                 /* xShmMap */
    rbuVfsShmLock,                /* xShmLock */
    rbuVfsShmBarrier,             /* xShmBarrier */
    rbuVfsShmUnmap,               /* xShmUnmap */
    0, 0                          /* xFetch, xUnfetch */
  };
  rbu_vfs *pRbuVfs = (rbu_vfs*)pVfs;
  sqlite3_vfs *pRealVfs = pRbuVfs->pRealVfs;
  rbu_file *pFd = (rbu_file *)pFile;
  int rc = SQLITE_OK;
  const char *zOpen = zName;
  int oflags = flags;

  memset(pFd, 0, sizeof(rbu_file));
  pFd->pReal = (sqlite3_file*)&pFd[1];
  pFd->pRbuVfs = pRbuVfs;
  pFd->openFlags = flags;
  if( zName ){
    if( flags & SQLITE_OPEN_MAIN_DB ){
      /* A main database has just been opened. The following block sets
      ** (pFd->zWal) to point to a buffer owned by SQLite that contains
      ** the name of the *-wal file this db connection will use. SQLite
      ** happens to pass a pointer to this buffer when using xAccess()
      ** or xOpen() to operate on the *-wal file.  */
      pFd->zWal = rbuMainToWal(zName, flags);
    }
    else if( flags & SQLITE_OPEN_WAL ){
      rbu_file *pDb = rbuFindMaindb(pRbuVfs, zName, 0);
      if( pDb ){
        if( pDb->pRbu && pDb->pRbu->eStage==RBU_STAGE_OAL ){
          /* This call is to open a *-wal file. Intead, open the *-oal. This
          ** code ensures that the string passed to xOpen() is terminated by a
          ** pair of '\0' bytes in case the VFS attempts to extract a URI 
          ** parameter from it.  */
          const char *zBase = zName;
          size_t nCopy;
          char *zCopy;
          if( rbuIsVacuum(pDb->pRbu) ){
            zBase = sqlite3_db_filename(pDb->pRbu->dbRbu, "main");
            zBase = rbuMainToWal(zBase, SQLITE_OPEN_URI);
          }
          nCopy = strlen(zBase);
          zCopy = sqlite3_malloc64(nCopy+2);
          if( zCopy ){
            memcpy(zCopy, zBase, nCopy);
            zCopy[nCopy-3] = 'o';
            zCopy[nCopy] = '\0';
            zCopy[nCopy+1] = '\0';
            zOpen = (const char*)(pFd->zDel = zCopy);
          }else{
            rc = SQLITE_NOMEM;
          }
          pFd->pRbu = pDb->pRbu;
        }
        pDb->pWalFd = pFd;
      }
    }
  }else{
    pFd->pRbu = pRbuVfs->pRbu;
  }

  if( oflags & SQLITE_OPEN_MAIN_DB 
   && sqlite3_uri_boolean(zName, "rbu_memory", 0) 
  ){
    assert( oflags & SQLITE_OPEN_MAIN_DB );
    oflags =  SQLITE_OPEN_TEMP_DB | SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE |
              SQLITE_OPEN_EXCLUSIVE | SQLITE_OPEN_DELETEONCLOSE;
    zOpen = 0;
  }

  if( rc==SQLITE_OK ){
    rc = pRealVfs->xOpen(pRealVfs, zOpen, pFd->pReal, oflags, pOutFlags);
  }
  if( pFd->pReal->pMethods ){
    /* The xOpen() operation has succeeded. Set the sqlite3_file.pMethods
    ** pointer and, if the file is a main database file, link it into the
    ** mutex protected linked list of all such files.  */
    pFile->pMethods = &rbuvfs_io_methods;
    if( flags & SQLITE_OPEN_MAIN_DB ){
      rbuMainlistAdd(pFd);
    }
  }else{
    sqlite3_free(pFd->zDel);
  }

  return rc;
}